

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool string_upper(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  uint uVar1;
  gravity_object_t *pgVar2;
  char *__dest;
  __int32_t **pp_Var3;
  gravity_fiber_t *pgVar4;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar5;
  int32_t index;
  uint uVar6;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 *paVar7;
  int i;
  ulong uVar8;
  _Bool _Var9;
  gravity_value_t value;
  gravity_value_t value_00;
  char _buffer [4096];
  
  pgVar2 = (args->field_1).p;
  uVar8 = 1;
  __dest = (char *)gravity_calloc(vm,1,(ulong)(*(int *)((long)&pgVar2->identifier + 4) + 1));
  if (__dest == (char *)0x0) {
LAB_0011dd8d:
    _Var9 = false;
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,rindex);
  }
  else {
    strcpy(__dest,(char *)pgVar2->objclass);
    if (nargs == 1) {
      pp_Var3 = __ctype_toupper_loc();
      for (uVar8 = 0; uVar6 = *(uint *)((long)&pgVar2->identifier + 4), uVar8 <= uVar6;
          uVar8 = uVar8 + 1) {
        __dest[uVar8] = (char)(*pp_Var3)[__dest[uVar8]];
      }
    }
    else {
      paVar7 = &args[1].field_1;
      for (; uVar8 < nargs; uVar8 = uVar8 + 1) {
        if (((gravity_value_t *)(paVar7 + -1))->isa != gravity_class_int) {
          free(__dest);
          builtin_strncpy(_buffer + 0x30,"arguments.",0xb);
          builtin_strncpy(_buffer + 0x20,"nts, or integer ",0x10);
          builtin_strncpy(_buffer + 0x10,"either no argume",0x10);
          builtin_strncpy(_buffer,"upper() expects ",0x10);
          pgVar4 = gravity_vm_fiber(vm);
          gravity_fiber_seterror(pgVar4,_buffer);
          goto LAB_0011dd8d;
        }
        uVar6 = *(uint *)paVar7;
        uVar1 = *(uint *)((long)&pgVar2->identifier + 4);
        if ((((int)uVar6 < 0) && (uVar6 = uVar6 + uVar1, (int)uVar6 < 0)) || (uVar1 <= uVar6)) {
          free(__dest);
          snprintf(_buffer,0x1000,"Out of bounds error: index %d beyond bounds 0...%d",(ulong)uVar6,
                   (ulong)(*(int *)((long)&pgVar2->identifier + 4) - 1));
          pgVar4 = gravity_vm_fiber(vm);
          gravity_fiber_seterror(pgVar4,_buffer);
          goto LAB_0011dd8d;
        }
        pp_Var3 = __ctype_toupper_loc();
        __dest[uVar6] = (char)(*pp_Var3)[__dest[uVar6]];
        paVar7 = paVar7 + 2;
      }
      uVar6 = *(uint32_t *)((long)&pgVar2->identifier + 4);
    }
    aVar5.p = (gravity_object_t *)gravity_string_new(vm,__dest,uVar6,0);
    value.field_1.p = (gravity_object_t *)aVar5.n;
    value.isa = (aVar5.p)->isa;
    gravity_vm_setslot(vm,value,rindex);
    _Var9 = true;
  }
  return _Var9;
}

Assistant:

static bool string_upper (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    gravity_string_t *main_str = VALUE_AS_STRING(GET_VALUE(0));

    char *ret = mem_alloc(vm, main_str->len + 1);
    CHECK_MEM_ALLOC(ret);
    strcpy(ret, main_str->s);

    // if no arguments passed, change the whole string to uppercase
    if (nargs == 1) {
        for (int i = 0; i <= main_str->len; ++i) {
         ret[i] = toupper(ret[i]);
        }
    }
    // otherwise, evaluate all the arguments
    else {
        for (int i = 1; i < nargs; ++i) {
            gravity_value_t value = GET_VALUE(i);
            if (VALUE_ISA_INT(value)) {
                int32_t index = (int32_t)VALUE_AS_INT(value);

                if (index < 0) index = main_str->len + index;
                if ((index < 0) || ((uint32_t)index >= main_str->len)) {
                    mem_free(ret);
                    RETURN_ERROR("Out of bounds error: index %d beyond bounds 0...%d", index, main_str->len - 1);
                }

                ret[index] = toupper(ret[index]);
            }
            else {
                mem_free(ret);
                RETURN_ERROR("upper() expects either no arguments, or integer arguments.");
            }
        }
    }

    gravity_string_t *s = gravity_string_new(vm, ret, main_str->len, 0);
    RETURN_VALUE(VALUE_FROM_OBJECT(s), rindex);
}